

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O3

ssize_t tnt_object_add_map(tnt_stream *s,uint32_t size)

{
  uint32_t *puVar1;
  tnt_sbo_type tVar2;
  void *pvVar3;
  tnt_sbuf_object *sbo;
  tnt_sbo_stack *ptVar4;
  byte bVar5;
  int iVar6;
  ssize_t sVar7;
  tnt_sbuf_object *ptVar8;
  undefined4 *puVar9;
  byte local_2e;
  undefined1 local_2d [4];
  undefined1 local_29 [3];
  char data [6];
  
  pvVar3 = s->data;
  sbo = *(tnt_sbuf_object **)((long)pvVar3 + 0x30);
  bVar5 = sbo->stack_size;
  if (bVar5 != 0) {
    puVar1 = &sbo->stack[bVar5 - 1].size;
    *puVar1 = *puVar1 + 1;
  }
  ptVar8 = sbo;
  if (bVar5 == sbo->stack_alloc) {
    iVar6 = tnt_sbuf_object_grow_stack(sbo);
    if (iVar6 == -1) {
      return -1;
    }
    bVar5 = sbo->stack_size;
    ptVar8 = *(tnt_sbuf_object **)((long)s->data + 0x30);
  }
  puVar9 = (undefined4 *)local_2d;
  ptVar4 = sbo->stack;
  ptVar4[bVar5].size = 0;
  ptVar4[bVar5].offset = *(size_t *)((long)pvVar3 + 8);
  ptVar4[bVar5].type = '\x06';
  sbo->stack_size = bVar5 + 1;
  tVar2 = ptVar8->type;
  if (tVar2 == TNT_SBO_PACKED) {
    local_2e = 0x80;
    goto LAB_001070f7;
  }
  if (tVar2 == TNT_SBO_SPARSE) {
    local_2d = (undefined1  [4])0x0;
  }
  else {
    if (tVar2 != TNT_SBO_SIMPLE) {
      return -1;
    }
    if (size < 0x10) {
      local_2e = (byte)size | 0x80;
      goto LAB_001070f7;
    }
    if (size < 0x10000) {
      local_2e = 0xde;
      local_2d._0_2_ = (ushort)size << 8 | (ushort)size >> 8;
      puVar9 = (undefined4 *)((long)local_2d + 2);
      goto LAB_001070f7;
    }
    local_2d = (undefined1  [4])
               (size >> 0x18 | (size & 0xff0000) >> 8 | (size & 0xff00) << 8 | size << 0x18);
  }
  local_2e = 0xdf;
  puVar9 = (undefined4 *)local_29;
LAB_001070f7:
  sVar7 = (*s->write)(s,(char *)&local_2e,(long)puVar9 - (long)&local_2e);
  return sVar7;
}

Assistant:

ssize_t
tnt_object_add_map (struct tnt_stream *s, uint32_t size)
{
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size > 0)
		sbo->stack[sbo->stack_size - 1].size += 1;
	char data[6], *end;
	struct tnt_stream_buf  *sb  = TNT_SBUF_CAST(s);
	if (sbo->stack_size == sbo->stack_alloc)
		if (tnt_sbuf_object_grow_stack(sbo) == -1)
			return -1;
	sbo->stack[sbo->stack_size].size = 0;
	sbo->stack[sbo->stack_size].offset = sb->size;
	sbo->stack[sbo->stack_size].type = MP_MAP;
	sbo->stack_size += 1;
	if (TNT_SOBJ_CAST(s)->type == TNT_SBO_SIMPLE) {
		end = mp_encode_map(data, size);
	} else if (TNT_SOBJ_CAST(s)->type == TNT_SBO_SPARSE) {
		end = mp_encode_map32(data, 0);
	} else if (TNT_SOBJ_CAST(s)->type == TNT_SBO_PACKED) {
		end = mp_encode_map(data, 0);
	} else {
		return -1;
	}
	ssize_t rv = s->write(s, data, end - data);
	return rv;
}